

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<float>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<float> *out)

{
  float *pfVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  
  if (ptr == (char *)0x0) {
    return (char *)0x0;
  }
  lVar4 = (long)this->buffer_end_ - (long)ptr;
  while( true ) {
    uVar3 = (int)lVar4 + 0x10;
    if (size <= (int)uVar3) {
      RepeatedField<float>::Reserve(out,out->current_size_ + (size >> 2));
      uVar3 = size & 0xfffffffc;
      pfVar1 = RepeatedField<float>::AddNAlreadyReserved(out,size >> 2);
      memcpy(pfVar1,ptr,(long)(int)uVar3);
      pcVar2 = (char *)0x0;
      if (size == uVar3) {
        pcVar2 = ptr + (int)uVar3;
      }
      return pcVar2;
    }
    RepeatedField<float>::Reserve(out,out->current_size_ + ((int)uVar3 >> 2));
    pfVar1 = RepeatedField<float>::AddNAlreadyReserved(out,(int)uVar3 >> 2);
    memcpy(pfVar1,ptr,(long)(int)(uVar3 & 0xfffffffc));
    if ((this->limit_ < 0x11) || (pcVar2 = Next(this), pcVar2 == (char *)0x0)) break;
    size = size - (uVar3 & 0xfffffffc);
    ptr = pcVar2 + (0x10 - (ulong)(uVar3 & 3));
    lVar4 = (long)this->buffer_end_ - (long)ptr;
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}